

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_4_suite::test_linear_decrease(void)

{
  undefined8 local_d8;
  value_type local_d0 [2];
  undefined8 local_c0;
  value_type local_b8 [2];
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined8 local_78;
  value_type local_70 [2];
  undefined8 local_60;
  value_type local_58 [2];
  undefined1 local_48 [8];
  moment<double,_4> filter;
  
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,10.0);
  local_58[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_60 = 0x4024000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x118,"void mean_double_4_suite::test_linear_decrease()",local_58,&local_60);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,9.0);
  local_70[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_78 = 0x4023000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x11a,"void mean_double_4_suite::test_linear_decrease()",local_70,&local_78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,8.0);
  local_88[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_90 = 0x4022000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x11c,"void mean_double_4_suite::test_linear_decrease()",local_88,&local_90);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,7.0);
  local_a0[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_a8 = 0x4021000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","8.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x11e,"void mean_double_4_suite::test_linear_decrease()",local_a0,&local_a8);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,6.0);
  local_b8[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_c0 = 0x401e000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","7.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x120,"void mean_double_4_suite::test_linear_decrease()",local_b8,&local_c0);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,5.0);
  local_d0[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_d8 = 0x401a000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","6.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x122,"void mean_double_4_suite::test_linear_decrease()",local_d0,&local_d8);
  return;
}

Assistant:

void test_linear_decrease()
{
    window::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(9.0);
    TRIAL_TEST_EQ(filter.mean(), 9.5);
    filter.push(8.0);
    TRIAL_TEST_EQ(filter.mean(), 9.0);
    filter.push(7.0);
    TRIAL_TEST_EQ(filter.mean(), 8.5);
    filter.push(6.0);
    TRIAL_TEST_EQ(filter.mean(), 7.5);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.mean(), 6.5);
}